

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pdu.cc
# Opt level: O0

bool __thiscall assembler::SessionPDU::append(SessionPDU *this,TransportPDU *tpdu)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  const_iterator this_00;
  TransportPDU *in_RDI;
  ImageStructureHeader IVar4;
  int in_stack_0000000c;
  SessionPDU *in_stack_00000010;
  int remaining;
  ImageStructureHeader ish;
  int skip;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  end;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  begin;
  uint sequenceCount;
  SessionPDU *in_stack_000000b8;
  const_iterator in_stack_000000c0;
  const_iterator in_stack_000000c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff58;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffff68;
  SessionPDU *in_stack_ffffffffffffff70;
  uint local_70;
  undefined8 in_stack_ffffffffffffffd0;
  
  uVar2 = TransportPDU::sequenceCount(in_RDI);
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_ffffffffffffff70);
  if (bVar1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_ffffffffffffff58);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+(in_stack_ffffffffffffff68,(difference_type)in_RDI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_ffffffffffffff58);
    TransportPDU::length(in_RDI);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+(in_stack_ffffffffffffff68,(difference_type)in_RDI);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator-(in_stack_ffffffffffffff68,(difference_type)in_RDI);
    *(uint *)&(in_RDI->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = uVar2;
    bVar1 = append(in_stack_000000b8,in_stack_000000c8,in_stack_000000c0);
    return bVar1;
  }
  iVar3 = diffWithWrap<16384u>
                    ((uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                     (uint)in_stack_ffffffffffffffd0);
  if (0 < iVar3 + -1) {
    bVar1 = hasCompleteHeader((SessionPDU *)0x2de62a);
    if (!bVar1) {
      return false;
    }
    if (*(char *)((long)&in_RDI[2].header.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + 4) != '\0') {
      return false;
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_> *)0x2de667);
    if (!bVar1) {
      return false;
    }
    IVar4 = getHeader<lrit::ImageStructureHeader>(in_stack_ffffffffffffff70);
    local_70 = IVar4._8_4_;
    if ((int)((local_70 & 0xffff) -
             *(int *)&in_RDI[3].data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start) < iVar3 + -1) {
      return false;
    }
    skipLines(in_stack_00000010,in_stack_0000000c);
  }
  *(uint *)&(in_RDI->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage = uVar2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_ffffffffffffff58);
  this_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                      (in_stack_ffffffffffffff58);
  __gnu_cxx::
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator-((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)this_00._M_current,(difference_type)in_RDI);
  bVar1 = append(in_stack_000000b8,in_stack_000000c8,in_stack_000000c0);
  return bVar1;
}

Assistant:

bool SessionPDU::append(const TransportPDU& tpdu) {
  auto sequenceCount = tpdu.sequenceCount();

  // First 10 bytes of the first TP_PDU appears to be garbage.
  // Last 2 bytes of every TP_PDU is a CRC.
  if (buf_.empty()) {
    auto begin = tpdu.data.begin() + 10;
    auto end = tpdu.data.begin() + tpdu.length() - 2;
    lastSequenceCount_ = sequenceCount;
    return append(begin, end);
  }

  // If one or more packets were skipped (dropped),
  // then we must figure out if it is OK synthesize contents
  // or if we must drop the entire session PDU.
  // This is only the case if the LRIT header was already received
  // and we're dealing with a line-by-line encoded image.
  auto skip = diffWithWrap<16384>(lastSequenceCount_, sequenceCount) - 1;
  if (skip > 0) {
    // Can't skip if the header is not yet complete.
    if (!hasCompleteHeader()) {
      return false;
    }

    // Can't skip if this is not an image
    if (ph_.fileType != 0) {
      return false;
    }

    // Can't skip if we don't know how many pixels to fill in
    if (!szParam_) {
      return false;
    }

    // Can't skip if we need to skip more lines than remaining
    auto ish = getHeader<lrit::ImageStructureHeader>();
    auto remaining = (int) ish.lines - (int) linesDone_;
    if (skip > remaining) {
      return false;
    }

    skipLines(skip);
  }

  lastSequenceCount_ = sequenceCount;
  return append(tpdu.data.begin(), tpdu.data.end() - 2);
}